

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O0

void mnf::ExpMapMatrix::logarithm(RefVec *out,OutputType *R)

{
  CoeffReturnType pdVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  Scalar SVar5;
  RealScalar RVar6;
  double dVar7;
  double dVar8;
  double coeff;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_a8;
  Matrix<double,3,3,0,3,3> local_90 [8];
  OutputType diff;
  double acosTr;
  double local_38;
  undefined1 local_30 [8];
  Vector3d v;
  OutputType *R_local;
  RefVec *out_local;
  
  v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)R;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)R,1,2);
  local_38 = -*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2],0,2);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2],0,1);
  acosTr = -*pdVar2;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_30,&local_38,pdVar1,&acosTr);
  SVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::trace
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                     v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array[2]);
  diff.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       acos((SVar5 - 1.0) / 2.0);
  RVar6 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_30);
  dVar7 = v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  if (1e-08 <= RVar6) {
    coeff = (double)Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                               v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[2]);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-
              (&local_a8,(MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)dVar7,
               (MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)&coeff)
    ;
    Eigen::Matrix<double,3,3,0,3,3>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>const>>
              (local_90,&local_a8);
    dVar8 = diff.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
            [8];
    dVar7 = sin(diff.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array[8]);
    dVar8 = dVar8 / (dVar7 * 2.0);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_90,2,1);
    dVar7 = *pSVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_30,0);
    *pSVar4 = dVar7 * dVar8;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_90,0,2);
    dVar7 = *pSVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_30,1);
    *pSVar4 = dVar7 * dVar8;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)local_90,1,0);
    dVar7 = *pSVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_30,2);
    *pSVar4 = dVar7 * dVar8;
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::operator=
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)out,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_30);
  }
  else {
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::operator=
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)out,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_30);
  }
  return;
}

Assistant:

void ExpMapMatrix::logarithm(RefVec out, const OutputType& R)
{
  Eigen::Vector3d v(-R(1, 2), R(0, 2), -R(0, 1));
  double acosTr = std::acos((R.trace() - 1) / 2);
  if (v.norm() < prec)
    out = v;
  else
  {
    OutputType diff(R - R.transpose());
    double coeff = acosTr / (2 * std::sin(acosTr));
    v(0) = diff(2, 1) * coeff;
    v(1) = diff(0, 2) * coeff;
    v(2) = diff(1, 0) * coeff;
    out = v;
  }
}